

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

void __thiscall
MultivariateTracker::MultivariateTracker
          (MultivariateTracker *this,long size,StatisticsTrackerOptions *options)

{
  undefined3 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  allocator_type local_31;
  value_type_conflict2 local_30;
  
  local_30 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&this->_covariance,size * size,&local_30,&local_31);
  uVar1 = *(undefined3 *)&(options->histogramOptions).field_0x9;
  (this->_options).histogramOptions.enabled = (options->histogramOptions).enabled;
  *(undefined3 *)&(this->_options).histogramOptions.field_0x9 = uVar1;
  bVar2 = options->doMax;
  bVar3 = options->doMean;
  bVar4 = options->doMin;
  bVar5 = options->doVar;
  uVar1 = *(undefined3 *)&options->field_0x5;
  iVar6 = (options->histogramOptions).binCount;
  iVar7 = (options->histogramOptions).cacheSize;
  (this->_options).doCov = options->doCov;
  (this->_options).doMax = bVar2;
  (this->_options).doMean = bVar3;
  (this->_options).doMin = bVar4;
  (this->_options).doVar = bVar5;
  *(undefined3 *)&(this->_options).field_0x5 = uVar1;
  (this->_options).histogramOptions.binCount = iVar6;
  (this->_options).histogramOptions.cacheSize = iVar7;
  (this->_statistics).super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_statistics).super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_statistics).super__Vector_base<StatisticsTracker,_std::allocator<StatisticsTracker>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  initialize(this,size,options);
  return;
}

Assistant:

MultivariateTracker(long size = 0,
                        StatisticsTrackerOptions const & options = StatisticsTrackerOptions()) :
        _covariance(std::vector<double>(size*size,0)),
        _options(options)
    {
        this->initialize(size, options);
    }